

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O2

unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
 __thiscall
tonk::
MakeUniqueNoThrow<asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>,asio::io_context&>
          (tonk *this,io_context *args)

{
  basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *this_00;
  
  this_00 = (basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *)
            operator_new(0x18,(nothrow_t *)&std::nothrow);
  if (this_00 != (basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> *)0x0) {
    asio::basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false>::basic_io_object
              (this_00,args);
  }
  *(basic_io_object<asio::ip::resolver_service<asio::ip::tcp>,_false> **)this = this_00;
  return (__uniq_ptr_data<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>,_true,_true>
          )(__uniq_ptr_data<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>,_true,_true>
            )this;
}

Assistant:

inline std::unique_ptr<T> MakeUniqueNoThrow(Args&&... args) {
    return std::unique_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}